

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O2

Resolver * __thiscall
avro::ResolverFactory::constructPrimitive<int>
          (ResolverFactory *this,NodePtr *writer,NodePtr *reader,Layout *offset)

{
  int iVar1;
  NonUnionToUnionParser *this_00;
  undefined *puVar2;
  PrimitiveLayout *primitiveLayout;
  
  iVar1 = (*writer->px->_vptr_Node[0xc])(writer->px,reader->px);
  if (iVar1 == 0) {
    this_00 = (NonUnionToUnionParser *)operator_new(8);
    (this_00->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_parse_001ef650;
  }
  else if (reader->px->type_ == AVRO_UNION) {
    this_00 = (NonUnionToUnionParser *)operator_new(0x38);
    NonUnionToUnionParser::NonUnionToUnionParser
              (this_00,this,writer,reader,(CompoundLayout *)offset);
  }
  else {
    switch(iVar1) {
    case 1:
      this_00 = (NonUnionToUnionParser *)operator_new(0x10);
      puVar2 = &PrimitiveParser<int>::vtable;
      break;
    case 2:
      this_00 = (NonUnionToUnionParser *)operator_new(0x10);
      puVar2 = &PrimitivePromoter<int,long>::vtable;
      break;
    case 3:
      this_00 = (NonUnionToUnionParser *)operator_new(0x10);
      puVar2 = &PrimitivePromoter<int,float>::vtable;
      break;
    case 4:
      this_00 = (NonUnionToUnionParser *)operator_new(0x10);
      puVar2 = &PrimitivePromoter<int,double>::vtable;
      break;
    default:
      return (Resolver *)0x0;
    }
    (this_00->super_Resolver)._vptr_Resolver = (_func_int **)(puVar2 + 0x10);
    (this_00->resolver_).px = *(element_type **)(offset + 8);
  }
  return &this_00->super_Resolver;
}

Assistant:

Resolver*
    constructPrimitive(const NodePtr &writer, const NodePtr &reader, const Layout &offset)
    {
        Resolver *instruction = 0;

        SchemaResolution match = writer->resolve(*reader);

        if (match == RESOLVE_NO_MATCH) {
            instruction = new PrimitiveSkipper<T>();
        } 
        else if (reader->type() == AVRO_UNION) {
            const CompoundLayout &compoundLayout = static_cast<const CompoundLayout &>(offset);
            instruction = new NonUnionToUnionParser(*this, writer, reader, compoundLayout);
        }
        else if (match == RESOLVE_MATCH) {
            const PrimitiveLayout &primitiveLayout = static_cast<const PrimitiveLayout &>(offset);
            instruction = new PrimitiveParser<T>(primitiveLayout);
        }
        else if(match == RESOLVE_PROMOTABLE_TO_LONG) {
            const PrimitiveLayout &primitiveLayout = static_cast<const PrimitiveLayout &>(offset);
            instruction = new PrimitivePromoter<T, int64_t>(primitiveLayout);
        }
        else if(match == RESOLVE_PROMOTABLE_TO_FLOAT) {
            const PrimitiveLayout &primitiveLayout = static_cast<const PrimitiveLayout &>(offset);
            instruction = new PrimitivePromoter<T, float>(primitiveLayout);
        }
        else if(match == RESOLVE_PROMOTABLE_TO_DOUBLE) {
            const PrimitiveLayout &primitiveLayout = static_cast<const PrimitiveLayout &>(offset);
            instruction = new PrimitivePromoter<T, double>(primitiveLayout);
        }
        else {
            assert(0);
        }
        return instruction;
    }